

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_ExprConstant * __thiscall
ZCCCompiler::NodeFromSymbolConst(ZCCCompiler *this,PSymbolConst *sym,ZCC_Expression *idnode)

{
  bool bVar1;
  ZCC_ExprConstant *pZVar2;
  FString *pFVar3;
  ZCC_ExprConstant *val;
  ZCC_Expression *idnode_local;
  PSymbolConst *sym_local;
  ZCCCompiler *this_local;
  
  pZVar2 = (ZCC_ExprConstant *)
           ZCC_AST::InitNode(this->AST,0x38,AST_ExprConstant,&idnode->super_ZCC_TreeNode);
  (pZVar2->super_ZCC_Expression).Operation = PEX_ConstValue;
  if (sym == (PSymbolConst *)0x0) {
    (pZVar2->super_ZCC_Expression).Type = &TypeError->super_PType;
    (pZVar2->field_0).IntVal = 0;
  }
  else {
    bVar1 = DObject::IsKindOf((DObject *)sym,PSymbolConstString::RegistrationInfo.MyClass);
    if (bVar1) {
      pFVar3 = FSharedStringArena::Alloc(&this->AST->Strings,(FString *)(sym + 1));
      (pZVar2->field_0).StringVal = pFVar3;
      (pZVar2->super_ZCC_Expression).Type = (PType *)TypeString;
    }
    else {
      (pZVar2->super_ZCC_Expression).Type = sym->ValueType;
      if ((pZVar2->super_ZCC_Expression).Type != &TypeError->super_PType) {
        bVar1 = DObject::IsKindOf((DObject *)sym,PSymbolConstNumeric::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                        ,0x264,
                        "ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *, ZCC_Expression *)"
                       );
        }
        bVar1 = DObject::IsKindOf(&sym->ValueType->super_DObject,PInt::RegistrationInfo.MyClass);
        if (bVar1) {
          (pZVar2->field_0).IntVal = *(int *)&sym[1].super_PSymbol.super_DObject._vptr_DObject;
        }
        else {
          bVar1 = DObject::IsKindOf(&sym->ValueType->super_DObject,PFloat::RegistrationInfo.MyClass)
          ;
          if (!bVar1) {
            __assert_fail("sym->ValueType->IsKindOf(RUNTIME_CLASS(PFloat))",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                          ,0x26b,
                          "ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *, ZCC_Expression *)"
                         );
          }
          pZVar2->field_0 = *(anon_union_8_4_c6e8ba38_for_ZCC_ExprConstant_1 *)(sym + 1);
        }
      }
    }
  }
  return pZVar2;
}

Assistant:

ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *sym, ZCC_Expression *idnode)
{
	ZCC_ExprConstant *val = static_cast<ZCC_ExprConstant *>(AST.InitNode(sizeof(*val), AST_ExprConstant, idnode));
	val->Operation = PEX_ConstValue;
	if (sym == NULL)
	{
		val->Type = TypeError;
		val->IntVal = 0;
	}
	else if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConstString)))
	{
		val->StringVal = AST.Strings.Alloc(static_cast<PSymbolConstString *>(sym)->Str);
		val->Type = TypeString;
	}
	else
	{
		val->Type = sym->ValueType;
		if (val->Type != TypeError)
		{
			assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
			if (sym->ValueType->IsKindOf(RUNTIME_CLASS(PInt)))
			{
				val->IntVal = static_cast<PSymbolConstNumeric *>(sym)->Value;
			}
			else
			{
				assert(sym->ValueType->IsKindOf(RUNTIME_CLASS(PFloat)));
				val->DoubleVal = static_cast<PSymbolConstNumeric *>(sym)->Float;
			}
		}
	}
	return val;
}